

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int ExportAlphaRGBA4444(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE WVar1;
  uint uVar2;
  WebPDecBuffer *pWVar3;
  uint8_t *puVar4;
  WebPRescaler *wrk;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  uint8_t *puVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  
  pWVar3 = p->output;
  puVar4 = (pWVar3->u).RGBA.rgba;
  lVar10 = (long)(pWVar3->u).RGBA.stride * (long)y_pos;
  puVar8 = puVar4 + lVar10 + 1;
  WVar1 = pWVar3->colorspace;
  uVar2 = p->scaler_a->dst_width;
  bVar9 = 0xf;
  iVar11 = 0;
  while( true ) {
    wrk = p->scaler_a;
    if (wrk->dst_y < wrk->dst_height) {
      bVar5 = wrk->y_accum < 1;
    }
    else {
      bVar5 = false;
    }
    if ((!bVar5) || (max_lines_out <= iVar11)) break;
    WebPRescalerExportRow(wrk);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        bVar6 = p->scaler_a->dst[uVar7] >> 4;
        puVar8[uVar7 * 2] = puVar8[uVar7 * 2] & 0xf0 | bVar6;
        bVar9 = bVar9 & bVar6;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    puVar8 = puVar8 + (pWVar3->u).RGBA.stride;
    iVar11 = iVar11 + 1;
  }
  if ((WVar1 - MODE_rgbA < 4) && (bVar9 != 0xf)) {
    (*WebPApplyAlphaMultiply4444)(puVar4 + lVar10,uVar2,iVar11,(pWVar3->u).RGBA.stride);
  }
  return iVar11;
}

Assistant:

static int ExportAlphaRGBA4444(WebPDecParams* const p, int y_pos,
                               int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (ptrdiff_t)y_pos * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
  uint8_t* alpha_dst = base_rgba;
#else
  uint8_t* alpha_dst = base_rgba + 1;
#endif
  int num_lines_out = 0;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int width = p->scaler_a->dst_width;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t alpha_mask = 0x0f;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    int i;
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    for (i = 0; i < width; ++i) {
      // Fill in the alpha value (converted to 4 bits).
      const uint32_t alpha_value = p->scaler_a->dst[i] >> 4;
      alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha_dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && alpha_mask != 0x0f) {
    WebPApplyAlphaMultiply4444(base_rgba, width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}